

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCMPrint.cpp
# Opt level: O1

int main(int argC,char **argV)

{
  char *__s1;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  size_t sVar6;
  XMLGrammarPoolImpl *this;
  long *plVar7;
  undefined8 uVar8;
  char16_t *pcVar9;
  long *plVar10;
  XSNamedMap<xercesc_4_0::XSObject> *pXVar11;
  XMLSize_t getAt;
  BaseRefVectorOf<char16_t> *pBVar12;
  char *pcVar13;
  BaseRefVectorOf<char16_t> *pBVar14;
  ulong uVar15;
  StrX *pSVar16;
  bool updatedXSModel;
  SCMPrintHandler handler;
  ifstream fin;
  char fURI [1000];
  BaseRefVectorOf<char16_t> *local_688;
  char **local_680;
  undefined1 local_671;
  XMLGrammarPoolImpl *local_670;
  uint local_664;
  ulong local_660;
  undefined **local_658;
  undefined **local_650;
  undefined **local_648;
  undefined **local_640;
  undefined **local_638;
  undefined **local_630;
  char local_628;
  long local_620 [4];
  uint auStack_600 [122];
  StrX local_418 [125];
  
  local_680 = argV;
  if (1 < argC) {
    pcVar13 = (char *)0x0;
    xercesc_4_0::XMLPlatformUtils::Initialize
              ((char *)&xercesc_4_0::XMLUni::fgXercescDefaultLocale,(char *)0x0,(PanicHandler *)0x0,
               (MemoryManager *)0x0);
    pBVar14 = (BaseRefVectorOf<char16_t> *)0x2;
    if (2 < argC) {
      pBVar14 = (BaseRefVectorOf<char16_t> *)(ulong)(uint)argC;
    }
    pBVar12 = (BaseRefVectorOf<char16_t> *)0x1;
    local_688 = (BaseRefVectorOf<char16_t> *)((ulong)local_688 & 0xffffffff00000000);
    bVar1 = false;
    do {
      __s1 = local_680[(long)pBVar12];
      if (*__s1 != '-') {
        pBVar14 = (BaseRefVectorOf<char16_t> *)((ulong)pBVar12 & 0xffffffff);
        break;
      }
      iVar5 = strcmp(__s1,"-?");
      if (iVar5 == 0) goto LAB_00105a78;
      pcVar13 = "-l";
      iVar5 = strcmp(__s1,"-l");
      if (iVar5 == 0) {
LAB_00105b81:
        bVar1 = true;
      }
      else {
        pcVar13 = "-L";
        iVar5 = strcmp(__s1,"-L");
        if (iVar5 == 0) goto LAB_00105b81;
        pcVar13 = "-f";
        iVar5 = strcmp(__s1,"-f");
        if (iVar5 == 0) {
LAB_00105b86:
          local_688 = (BaseRefVectorOf<char16_t> *)
                      CONCAT44(local_688._4_4_,(int)CONCAT71((uint7)(uint3)((uint)iVar5 >> 8),1));
        }
        else {
          pcVar13 = "-F";
          iVar5 = strcmp(__s1,"-F");
          if (iVar5 == 0) goto LAB_00105b86;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Unknown option \'",0x10);
          pcVar13 = local_680[(long)pBVar12];
          if (pcVar13 == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x10d210);
          }
          else {
            sVar6 = strlen(pcVar13);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar13,sVar6);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"\', ignoring it\n",0xf);
          cVar4 = std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
          pcVar13 = (char *)(ulong)(uint)(int)cVar4;
          std::ostream::put('\x10');
          std::ostream::flush();
        }
      }
      pBVar12 = pBVar12 + 1;
    } while (pBVar14 != pBVar12);
    if ((int)pBVar14 == argC + -1) {
      this = (XMLGrammarPoolImpl *)
             xercesc_4_0::XMemory::operator_new((XMemory *)0x40,(ulong)pcVar13);
      xercesc_4_0::XMLGrammarPoolImpl::XMLGrammarPoolImpl
                (this,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      plVar7 = (long *)xercesc_4_0::XMLReaderFactory::createXMLReader
                                 (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,
                                  (XMLGrammarPool *)this);
      (**(code **)(*plVar7 + 0x60))(plVar7,&xercesc_4_0::XMLUni::fgSAX2CoreNameSpaces,1);
      (**(code **)(*plVar7 + 0x60))(plVar7,&xercesc_4_0::XMLUni::fgXercesSchema,1);
      (**(code **)(*plVar7 + 0x60))(plVar7,&xercesc_4_0::XMLUni::fgXercesHandleMultipleImports,1);
      (**(code **)(*plVar7 + 0x60))
                (plVar7,&xercesc_4_0::XMLUni::fgXercesSchemaFullChecking,(byte)local_688 & 1);
      (**(code **)(*plVar7 + 0x60))(plVar7,&xercesc_4_0::XMLUni::fgSAX2CoreNameSpacePrefixes,0);
      (**(code **)(*plVar7 + 0x60))(plVar7,&xercesc_4_0::XMLUni::fgSAX2CoreValidation,1);
      (**(code **)(*plVar7 + 0x60))(plVar7,&xercesc_4_0::XMLUni::fgXercesDynamic,1);
      (**(code **)(*plVar7 + 0x68))
                (plVar7,&xercesc_4_0::XMLUni::fgXercesScannerName,
                 &xercesc_4_0::XMLUni::fgSGXMLScanner);
      local_658 = &PTR__SCMPrintHandler_0010b4d8;
      local_650 = &PTR__SCMPrintHandler_0010b5f0;
      local_648 = &PTR__SCMPrintHandler_0010b628;
      local_640 = &PTR__SCMPrintHandler_0010b6a0;
      local_638 = &PTR__SCMPrintHandler_0010b6e0;
      local_630 = &PTR__SCMPrintHandler_0010b738;
      local_628 = '\0';
      local_670 = this;
      (**(code **)(*plVar7 + 0x58))(plVar7);
      std::ifstream::ifstream(local_620);
      local_688 = pBVar14;
      if (bVar1) {
        std::ifstream::open((char *)local_620,(_Ios_Openmode)local_680[(long)pBVar14]);
      }
      local_664 = *(uint *)((long)auStack_600 + *(long *)(local_620[0] + -0x18));
      if ((local_664 & 5) == 0) {
        bVar2 = true;
        local_660 = 0;
        do {
          if (!bVar2) break;
          memset(local_418,0,1000);
          if (bVar1) {
            bVar3 = true;
            if ((*(byte *)((long)auStack_600 + *(long *)(local_620[0] + -0x18)) & 2) == 0) {
              std::ios::widen((char)&local_688 + (char)*(long *)(local_620[0] + -0x18) + 'h');
              std::istream::getline((char *)local_620,(long)local_418,-0x18);
              if ((char)local_418[0].fLocalForm != '\0') {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"==Parsing== ",0xc);
                sVar6 = strlen((char *)local_418);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,(char *)local_418,sVar6);
                std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
                std::ostream::put('\x10');
                std::ostream::flush();
                pSVar16 = local_418;
                goto LAB_00105f17;
              }
              goto LAB_00105f45;
            }
          }
          else {
            pSVar16 = (StrX *)local_680[(long)local_688];
            bVar2 = false;
LAB_00105f17:
            uVar8 = (**(code **)(*plVar7 + 0x138))(plVar7,pSVar16,1,1);
            if (local_628 == '\x01') {
              local_628 = '\0';
            }
            else {
              local_660 = CONCAT71((int7)((ulong)uVar8 >> 8),1);
            }
LAB_00105f45:
            bVar3 = false;
          }
        } while (!bVar3);
        if ((local_660 & 1) == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "Did not parse a schema document cleanly so not printing Schema for Schema XSModel information"
                     ,0x5d);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "********** Printing out information from Schema **********",0x3a);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n\n",2);
          local_680 = (char **)(**(code **)(*(long *)local_670 + 0x68))(local_670,&local_671);
          if (local_680 == (char **)0x0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"No XSModel to print",0x13);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n\n",2);
          }
          else {
            local_688 = (BaseRefVectorOf<char16_t> *)local_680[1];
            if (*(long *)(local_688 + 0x10) != 0) {
              getAt = 0;
              uVar15 = 1;
              do {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Processing Namespace:   ",0x18);
                pcVar9 = xercesc_4_0::BaseRefVectorOf<char16_t>::elementAt(local_688,getAt);
                if ((pcVar9 != (char16_t *)0x0) && (*pcVar9 != L'\0')) {
                  pcVar13 = (char *)xercesc_4_0::XMLString::transcode
                                              (pcVar9,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                                              );
                  local_418[0].fLocalForm = pcVar13;
                  if (pcVar13 == (char *)0x0) {
                    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10d0c0);
                  }
                  else {
                    sVar6 = strlen(pcVar13);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,pcVar13,sVar6);
                  }
                  StrX::~StrX(local_418);
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"\n============================================",
                           0x2d);
                std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
                std::ostream::put(-0x40);
                plVar10 = (long *)std::ostream::flush();
                std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
                std::ostream::put((char)plVar10);
                std::ostream::flush();
                pXVar11 = (XSNamedMap<xercesc_4_0::XSObject> *)
                          xercesc_4_0::XSModel::getComponentsByNamespace
                                    ((COMPONENT_TYPE)local_680,(wchar16 *)0x2);
                processElements(pXVar11);
                pXVar11 = (XSNamedMap<xercesc_4_0::XSObject> *)
                          xercesc_4_0::XSModel::getComponentsByNamespace
                                    ((COMPONENT_TYPE)local_680,(wchar16 *)0x3);
                processTypeDefinitions(pXVar11);
                bVar1 = uVar15 < *(ulong *)(local_688 + 0x10);
                getAt = uVar15;
                uVar15 = (ulong)((int)uVar15 + 1);
              } while (bVar1);
            }
          }
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
        std::ostream::put(-0x40);
        iVar5 = 0;
        std::ostream::flush();
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Cannot open the list file: ",0x1b);
        pcVar13 = local_680[(long)local_688];
        if (pcVar13 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x10d210);
        }
        else {
          sVar6 = strlen(pcVar13);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar13,sVar6);
        }
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
        std::ostream::put('\x10');
        iVar5 = 3;
        std::ostream::flush();
      }
      std::ifstream::~ifstream(local_620);
      if ((local_664 & 5) != 0) {
        return iVar5;
      }
      if (plVar7 != (long *)0x0) {
        (**(code **)(*plVar7 + 8))(plVar7);
      }
      if (local_670 != (XMLGrammarPoolImpl *)0x0) {
        (**(code **)(*(long *)local_670 + 8))();
      }
      xercesc_4_0::XMLPlatformUtils::Terminate();
      return 0;
    }
  }
LAB_00105a78:
  usage();
  return 1;
}

Assistant:

int main(int argC, char* argV[])
{
    // Check command line and extract arguments.
    if (argC < 2)
    {
        usage();
        return 1;
    }

    // cannot return out of catch-blocks lest exception-destruction
    // result in calls to destroyed memory handler!
    int errorCode = 0;
    try
    {
        XMLPlatformUtils::Initialize();
    }

    catch (const XMLException& toCatch)
    {
        std::cerr   << "Error during initialization! Message:\n"
        << StrX(toCatch.getMessage()) << std::endl;
        errorCode = 2;
    }
    if(errorCode) {
        XMLPlatformUtils::Terminate();
        return errorCode;
    }

    bool							doList				= false;
    bool							schemaFullChecking	= false;
    const char*                     xsdFile             = 0;
    int argInd;

    for (argInd = 1; argInd < argC; argInd++)
    {
        // Break out on first parm not starting with a dash
        if (argV[argInd][0] != '-')
            break;

        // Watch for special case help request
        if (!strcmp(argV[argInd], "-?"))
        {
            usage();
            return 1;
        }
        else if (!strcmp(argV[argInd], "-l")
              ||  !strcmp(argV[argInd], "-L"))
        {
            doList = true;
        }
        else if (!strcmp(argV[argInd], "-f")
              ||  !strcmp(argV[argInd], "-F"))
        {
            schemaFullChecking = true;
        }
        else
        {
            std::cerr << "Unknown option '" << argV[argInd]
                << "', ignoring it\n" << std::endl;
        }
    }

    //
    //  There should be only one and only one parameter left, and that
    //  should be the file name.
    //
    if (argInd != argC - 1)
    {
        usage();
        return 1;
    }

    XMLGrammarPool *grammarPool = 0;
    SAX2XMLReader* parser = 0;
    try
    {
        grammarPool = new XMLGrammarPoolImpl(XMLPlatformUtils::fgMemoryManager);

        parser = XMLReaderFactory::createXMLReader(XMLPlatformUtils::fgMemoryManager, grammarPool);
        parser->setFeature(XMLUni::fgSAX2CoreNameSpaces, true);
        parser->setFeature(XMLUni::fgXercesSchema, true);
        parser->setFeature(XMLUni::fgXercesHandleMultipleImports, true);
        parser->setFeature(XMLUni::fgXercesSchemaFullChecking, schemaFullChecking);
        parser->setFeature(XMLUni::fgSAX2CoreNameSpacePrefixes, false);
        parser->setFeature(XMLUni::fgSAX2CoreValidation, true);
        parser->setFeature(XMLUni::fgXercesDynamic, true);
        parser->setProperty(XMLUni::fgXercesScannerName, (void *)XMLUni::fgSGXMLScanner);

        SCMPrintHandler handler;
        parser->setErrorHandler(&handler);

        bool more = true;
        bool parsedOneSchemaOkay = false;
        std::ifstream fin;

        // the input is a list file
        if (doList)
            fin.open(argV[argInd]);

        if (fin.fail()) {
            std::cerr <<"Cannot open the list file: " << argV[argInd] << std::endl;
            return 3;
        }

        while (more)
        {
            char fURI[1000];
            //initialize the array to zeros
            memset(fURI,0,sizeof(fURI));

            if (doList) {
                if (! fin.eof() ) {
                    fin.getline (fURI, sizeof(fURI));
                    if (!*fURI)
                        continue;
                    else {
                        xsdFile = fURI;
                        std::cerr << "==Parsing== " << xsdFile << std::endl;
                    }
                }
                else
                    break;
            }
            else {
                xsdFile = argV[argInd];
                more = false;
            }

            parser->loadGrammar(xsdFile, Grammar::SchemaGrammarType, true);
            if (handler.getSawErrors())
            {
                handler.resetErrors();
            }
            else
            {
                parsedOneSchemaOkay = true;
            }
        }

        if (parsedOneSchemaOkay)
        {
            std::cout << "********** Printing out information from Schema **********" << "\n\n";
            bool updatedXSModel;
            XSModel *xsModel = grammarPool->getXSModel(updatedXSModel);
            if (xsModel)
            {
                StringList *namespaces = xsModel->getNamespaces();
                for (unsigned i = 0; i < namespaces->size(); i++) {

                    std::cout << "Processing Namespace:   ";
                    const XMLCh *nameSpace = namespaces->elementAt(i);
                    if (nameSpace && *nameSpace)
                        std::cout << StrX(nameSpace);
                    std::cout << "\n============================================" << std::endl << std::endl;

                    processElements(xsModel->getComponentsByNamespace(XSConstants::ELEMENT_DECLARATION,
                                                                  nameSpace));
                    processTypeDefinitions(xsModel->getComponentsByNamespace(XSConstants::TYPE_DEFINITION,
                                                                         nameSpace));
                }
            }
            else
            {
                std::cout << "No XSModel to print" << "\n\n";
            }
        }
        else
        {
            std::cout << "Did not parse a schema document cleanly so not printing Schema for Schema XSModel information";
        }

        std::cout << std::endl;
    }
    catch (const OutOfMemoryException&)
    {
        std::cerr << "OutOfMemoryException during parsing: '" << xsdFile << "'\n" << std::endl;
        errorCode = 6;
    }
    catch (const XMLException& e)
    {
        std::cerr << "\nError during parsing: '" << xsdFile << "'\n"
        << "Exception message is:  \n"
        << StrX(e.getMessage()) << std::endl;
        errorCode = 4;
    }
    catch (...)
    {
        std::cerr << "\nUnexpected exception during parsing: '" << xsdFile << "'\n" << std::endl;
        errorCode = 5;
    }

    delete parser;
    delete grammarPool;
    XMLPlatformUtils::Terminate();

    return errorCode;
}